

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int allocateBtreePage(BtShared *pBt,MemPage **ppPage,Pgno *pPgno,Pgno nearby,u8 eMode)

{
  bool bVar1;
  int iVar2;
  u32 uVar3;
  Pgno PVar4;
  uint uVar5;
  MemPage *local_b0;
  MemPage *pPg;
  uint local_a0;
  int bNoContent;
  int noContent;
  int d2;
  int dist;
  u32 i;
  uchar *aData;
  uint local_80;
  Pgno iPage;
  u32 closest;
  Pgno iNewTrunk;
  MemPage *pNewTrunk;
  uint local_68;
  u8 eType;
  u32 nSearch;
  Pgno PStack_5c;
  u8 searchList;
  Pgno iTrunk;
  Pgno mxPage;
  MemPage *pPrevTrunk;
  MemPage *pTrunk;
  u32 local_40;
  u32 k;
  u32 n;
  int rc;
  MemPage *pPage1;
  u8 eMode_local;
  Pgno *pPStack_28;
  Pgno nearby_local;
  Pgno *pPgno_local;
  MemPage **ppPage_local;
  BtShared *pBt_local;
  
  pPrevTrunk = (MemPage *)0x0;
  _iTrunk = (MemPage *)0x0;
  _n = pBt->pPage1;
  pPage1._3_1_ = eMode;
  pPage1._4_4_ = nearby;
  pPStack_28 = pPgno;
  pPgno_local = (Pgno *)ppPage;
  ppPage_local = (MemPage **)pBt;
  PStack_5c = btreePagecount(pBt);
  local_40 = sqlite3Get4byte(_n->aData + 0x24);
  if (PStack_5c <= local_40) {
    iVar2 = sqlite3CorruptError(0xfbb5);
    return iVar2;
  }
  if (local_40 == 0) {
    pPg._4_4_ = (uint)(*(char *)((long)ppPage_local + 0x23) == '\0');
    k = sqlite3PagerWrite(ppPage_local[3]->pDbPage);
    if (k != 0) {
      return k;
    }
    *(int *)((long)ppPage_local + 0x3c) = *(int *)((long)ppPage_local + 0x3c) + 1;
    if (*(int *)((long)ppPage_local + 0x3c) ==
        (uint)sqlite3PendingByte / *(uint *)(ppPage_local + 6) + 1) {
      *(int *)((long)ppPage_local + 0x3c) = *(int *)((long)ppPage_local + 0x3c) + 1;
    }
    if ((*(char *)((long)ppPage_local + 0x21) != '\0') &&
       (PVar4 = ptrmapPageno((BtShared *)ppPage_local,*(Pgno *)((long)ppPage_local + 0x3c)),
       PVar4 == *(Pgno *)((long)ppPage_local + 0x3c))) {
      local_b0 = (MemPage *)0x0;
      k = btreeGetUnusedPage((BtShared *)ppPage_local,*(Pgno *)((long)ppPage_local + 0x3c),&local_b0
                             ,pPg._4_4_);
      if (k == 0) {
        k = sqlite3PagerWrite(local_b0->pDbPage);
        releasePage(local_b0);
      }
      if (k != 0) {
        return k;
      }
      *(int *)((long)ppPage_local + 0x3c) = *(int *)((long)ppPage_local + 0x3c) + 1;
      if (*(int *)((long)ppPage_local + 0x3c) ==
          (uint)sqlite3PendingByte / *(uint *)(ppPage_local + 6) + 1) {
        *(int *)((long)ppPage_local + 0x3c) = *(int *)((long)ppPage_local + 0x3c) + 1;
      }
    }
    sqlite3Put4byte(ppPage_local[3]->aData + 0x1c,*(u32 *)((long)ppPage_local + 0x3c));
    *pPStack_28 = *(Pgno *)((long)ppPage_local + 0x3c);
    k = btreeGetUnusedPage((BtShared *)ppPage_local,*pPStack_28,(MemPage **)pPgno_local,pPg._4_4_);
    if (k != 0) {
      return k;
    }
    k = sqlite3PagerWrite(*(PgHdr **)(*(long *)pPgno_local + 0x70));
    if (k != 0) {
      releasePage(*(MemPage **)pPgno_local);
      pPgno_local[0] = 0;
      pPgno_local[1] = 0;
    }
  }
  else {
    eType = '\0';
    local_68 = 0;
    if (pPage1._3_1_ == '\x01') {
      if (pPage1._4_4_ <= PStack_5c) {
        iVar2 = ptrmapGet((BtShared *)ppPage_local,pPage1._4_4_,(u8 *)((long)&pNewTrunk + 7),
                          (Pgno *)0x0);
        if (iVar2 != 0) {
          return iVar2;
        }
        if (pNewTrunk._7_1_ == '\x02') {
          eType = '\x01';
        }
        k = 0;
      }
    }
    else {
      eType = pPage1._3_1_ == '\x02';
    }
    k = sqlite3PagerWrite(_n->pDbPage);
    if (k != 0) {
      return k;
    }
    sqlite3Put4byte(_n->aData + 0x24,local_40 - 1);
    do {
      _iTrunk = pPrevTrunk;
      if (pPrevTrunk == (MemPage *)0x0) {
        nSearch = sqlite3Get4byte(_n->aData + 0x20);
      }
      else {
        nSearch = sqlite3Get4byte(pPrevTrunk->aData);
      }
      if ((PStack_5c < nSearch) ||
         (uVar5 = local_68 + 1, bVar1 = local_40 < local_68, local_68 = uVar5, bVar1)) {
        k = sqlite3CorruptError(0xfbed);
      }
      else {
        k = btreeGetUnusedPage((BtShared *)ppPage_local,nSearch,&pPrevTrunk,0);
      }
      if (k != 0) {
        pPrevTrunk = (MemPage *)0x0;
        break;
      }
      pTrunk._4_4_ = sqlite3Get4byte(pPrevTrunk->aData + 4);
      if ((pTrunk._4_4_ == 0) && (eType == '\0')) {
        k = sqlite3PagerWrite(pPrevTrunk->pDbPage);
        if (k != 0) break;
        *pPStack_28 = nSearch;
        *(undefined4 *)(_n->aData + 0x20) = *(undefined4 *)pPrevTrunk->aData;
        *(MemPage **)pPgno_local = pPrevTrunk;
        pPrevTrunk = (MemPage *)0x0;
      }
      else {
        if ((*(uint *)((long)ppPage_local + 0x34) >> 2) - 2 < pTrunk._4_4_) {
          k = sqlite3CorruptError(0xfc0a);
          break;
        }
        if ((eType == '\0') ||
           ((pPage1._4_4_ != nSearch && ((pPage1._4_4_ <= nSearch || (pPage1._3_1_ != '\x02')))))) {
          if (pTrunk._4_4_ != 0) {
            _dist = pPrevTrunk->aData;
            if (pPage1._4_4_ == 0) {
              local_80 = 0;
            }
            else {
              local_80 = 0;
              if (pPage1._3_1_ == '\x02') {
                for (d2 = 0; (uint)d2 < pTrunk._4_4_; d2 = d2 + 1) {
                  aData._4_4_ = sqlite3Get4byte(_dist + (d2 * 4 + 8));
                  if (aData._4_4_ <= pPage1._4_4_) {
                    local_80 = d2;
                    break;
                  }
                }
              }
              else {
                uVar3 = sqlite3Get4byte(_dist + 8);
                noContent = sqlite3AbsInt32(uVar3 - pPage1._4_4_);
                for (d2 = 1; (uint)d2 < pTrunk._4_4_; d2 = d2 + 1) {
                  uVar3 = sqlite3Get4byte(_dist + (d2 * 4 + 8));
                  bNoContent = sqlite3AbsInt32(uVar3 - pPage1._4_4_);
                  if (bNoContent < noContent) {
                    local_80 = d2;
                    noContent = bNoContent;
                  }
                }
              }
            }
            aData._4_4_ = sqlite3Get4byte(_dist + (local_80 * 4 + 8));
            if (PStack_5c < aData._4_4_) {
              k = sqlite3CorruptError(0xfc6d);
              break;
            }
            if (((eType == '\0') || (aData._4_4_ == pPage1._4_4_)) ||
               ((aData._4_4_ < pPage1._4_4_ && (pPage1._3_1_ == '\x02')))) {
              *pPStack_28 = aData._4_4_;
              k = sqlite3PagerWrite(pPrevTrunk->pDbPage);
              if (k != 0) break;
              if (local_80 < pTrunk._4_4_ - 1) {
                *(undefined4 *)(_dist + (local_80 * 4 + 8)) =
                     *(undefined4 *)(_dist + (pTrunk._4_4_ * 4 + 4));
              }
              sqlite3Put4byte(_dist + 4,pTrunk._4_4_ - 1);
              iVar2 = btreeGetHasContent((BtShared *)ppPage_local,*pPStack_28);
              local_a0 = (uint)(iVar2 == 0);
              k = btreeGetUnusedPage((BtShared *)ppPage_local,*pPStack_28,(MemPage **)pPgno_local,
                                     local_a0);
              if ((k == 0) &&
                 (k = sqlite3PagerWrite(*(PgHdr **)(*(long *)pPgno_local + 0x70)), k != 0)) {
                releasePage(*(MemPage **)pPgno_local);
                pPgno_local[0] = 0;
                pPgno_local[1] = 0;
              }
              eType = '\0';
            }
          }
        }
        else {
          *pPStack_28 = nSearch;
          *(MemPage **)pPgno_local = pPrevTrunk;
          eType = '\0';
          k = sqlite3PagerWrite(pPrevTrunk->pDbPage);
          if (k != 0) break;
          if (pTrunk._4_4_ == 0) {
            if (_iTrunk == (MemPage *)0x0) {
              *(undefined4 *)(_n->aData + 0x20) = *(undefined4 *)pPrevTrunk->aData;
            }
            else {
              k = sqlite3PagerWrite(_iTrunk->pDbPage);
              if (k != 0) break;
              *(undefined4 *)_iTrunk->aData = *(undefined4 *)pPrevTrunk->aData;
            }
          }
          else {
            iPage = sqlite3Get4byte(pPrevTrunk->aData + 8);
            if (PStack_5c < iPage) {
              k = sqlite3CorruptError(0xfc2c);
              break;
            }
            k = btreeGetUnusedPage((BtShared *)ppPage_local,iPage,(MemPage **)&closest,0);
            if (k != 0) break;
            k = sqlite3PagerWrite(_closest->pDbPage);
            if (k != 0) {
              releasePage(_closest);
              break;
            }
            *(undefined4 *)_closest->aData = *(undefined4 *)pPrevTrunk->aData;
            sqlite3Put4byte(_closest->aData + 4,pTrunk._4_4_ - 1);
            memcpy(_closest->aData + 8,pPrevTrunk->aData + 0xc,(ulong)((pTrunk._4_4_ - 1) * 4));
            releasePage(_closest);
            if (_iTrunk == (MemPage *)0x0) {
              sqlite3Put4byte(_n->aData + 0x20,iPage);
            }
            else {
              k = sqlite3PagerWrite(_iTrunk->pDbPage);
              if (k != 0) break;
              sqlite3Put4byte(_iTrunk->aData,iPage);
            }
          }
          pPrevTrunk = (MemPage *)0x0;
        }
      }
      releasePage(_iTrunk);
      _iTrunk = (MemPage *)0x0;
    } while (eType != '\0');
  }
  releasePage(pPrevTrunk);
  releasePage(_iTrunk);
  return k;
}

Assistant:

static int allocateBtreePage(
  BtShared *pBt,         /* The btree */
  MemPage **ppPage,      /* Store pointer to the allocated page here */
  Pgno *pPgno,           /* Store the page number here */
  Pgno nearby,           /* Search for a page near this one */
  u8 eMode               /* BTALLOC_EXACT, BTALLOC_LT, or BTALLOC_ANY */
){
  MemPage *pPage1;
  int rc;
  u32 n;     /* Number of pages on the freelist */
  u32 k;     /* Number of leaves on the trunk of the freelist */
  MemPage *pTrunk = 0;
  MemPage *pPrevTrunk = 0;
  Pgno mxPage;     /* Total size of the database file */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( eMode==BTALLOC_ANY || (nearby>0 && IfNotOmitAV(pBt->autoVacuum)) );
  pPage1 = pBt->pPage1;
  mxPage = btreePagecount(pBt);
  /* EVIDENCE-OF: R-05119-02637 The 4-byte big-endian integer at offset 36
  ** stores stores the total number of pages on the freelist. */
  n = get4byte(&pPage1->aData[36]);
  testcase( n==mxPage-1 );
  if( n>=mxPage ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( n>0 ){
    /* There are pages on the freelist.  Reuse one of those pages. */
    Pgno iTrunk;
    u8 searchList = 0; /* If the free-list must be searched for 'nearby' */
    u32 nSearch = 0;   /* Count of the number of search attempts */
    
    /* If eMode==BTALLOC_EXACT and a query of the pointer-map
    ** shows that the page 'nearby' is somewhere on the free-list, then
    ** the entire-list will be searched for that page.
    */
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( eMode==BTALLOC_EXACT ){
      if( nearby<=mxPage ){
        u8 eType;
        assert( nearby>0 );
        assert( pBt->autoVacuum );
        rc = ptrmapGet(pBt, nearby, &eType, 0);
        if( rc ) return rc;
        if( eType==PTRMAP_FREEPAGE ){
          searchList = 1;
        }
      }
    }else if( eMode==BTALLOC_LE ){
      searchList = 1;
    }
#endif

    /* Decrement the free-list count by 1. Set iTrunk to the index of the
    ** first free-list trunk page. iPrevTrunk is initially 1.
    */
    rc = sqlite3PagerWrite(pPage1->pDbPage);
    if( rc ) return rc;
    put4byte(&pPage1->aData[36], n-1);

    /* The code within this loop is run only once if the 'searchList' variable
    ** is not true. Otherwise, it runs once for each trunk-page on the
    ** free-list until the page 'nearby' is located (eMode==BTALLOC_EXACT)
    ** or until a page less than 'nearby' is located (eMode==BTALLOC_LT)
    */
    do {
      pPrevTrunk = pTrunk;
      if( pPrevTrunk ){
        /* EVIDENCE-OF: R-01506-11053 The first integer on a freelist trunk page
        ** is the page number of the next freelist trunk page in the list or
        ** zero if this is the last freelist trunk page. */
        iTrunk = get4byte(&pPrevTrunk->aData[0]);
      }else{
        /* EVIDENCE-OF: R-59841-13798 The 4-byte big-endian integer at offset 32
        ** stores the page number of the first page of the freelist, or zero if
        ** the freelist is empty. */
        iTrunk = get4byte(&pPage1->aData[32]);
      }
      testcase( iTrunk==mxPage );
      if( iTrunk>mxPage || nSearch++ > n ){
        rc = SQLITE_CORRUPT_BKPT;
      }else{
        rc = btreeGetUnusedPage(pBt, iTrunk, &pTrunk, 0);
      }
      if( rc ){
        pTrunk = 0;
        goto end_allocate_page;
      }
      assert( pTrunk!=0 );
      assert( pTrunk->aData!=0 );
      /* EVIDENCE-OF: R-13523-04394 The second integer on a freelist trunk page
      ** is the number of leaf page pointers to follow. */
      k = get4byte(&pTrunk->aData[4]);
      if( k==0 && !searchList ){
        /* The trunk has no leaves and the list is not being searched. 
        ** So extract the trunk page itself and use it as the newly 
        ** allocated page */
        assert( pPrevTrunk==0 );
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        *pPgno = iTrunk;
        memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
        *ppPage = pTrunk;
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
      }else if( k>(u32)(pBt->usableSize/4 - 2) ){
        /* Value of k is out of range.  Database corruption */
        rc = SQLITE_CORRUPT_BKPT;
        goto end_allocate_page;
#ifndef SQLITE_OMIT_AUTOVACUUM
      }else if( searchList 
            && (nearby==iTrunk || (iTrunk<nearby && eMode==BTALLOC_LE)) 
      ){
        /* The list is being searched and this trunk page is the page
        ** to allocate, regardless of whether it has leaves.
        */
        *pPgno = iTrunk;
        *ppPage = pTrunk;
        searchList = 0;
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        if( k==0 ){
          if( !pPrevTrunk ){
            memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc!=SQLITE_OK ){
              goto end_allocate_page;
            }
            memcpy(&pPrevTrunk->aData[0], &pTrunk->aData[0], 4);
          }
        }else{
          /* The trunk page is required by the caller but it contains 
          ** pointers to free-list leaves. The first leaf becomes a trunk
          ** page in this case.
          */
          MemPage *pNewTrunk;
          Pgno iNewTrunk = get4byte(&pTrunk->aData[8]);
          if( iNewTrunk>mxPage ){ 
            rc = SQLITE_CORRUPT_BKPT;
            goto end_allocate_page;
          }
          testcase( iNewTrunk==mxPage );
          rc = btreeGetUnusedPage(pBt, iNewTrunk, &pNewTrunk, 0);
          if( rc!=SQLITE_OK ){
            goto end_allocate_page;
          }
          rc = sqlite3PagerWrite(pNewTrunk->pDbPage);
          if( rc!=SQLITE_OK ){
            releasePage(pNewTrunk);
            goto end_allocate_page;
          }
          memcpy(&pNewTrunk->aData[0], &pTrunk->aData[0], 4);
          put4byte(&pNewTrunk->aData[4], k-1);
          memcpy(&pNewTrunk->aData[8], &pTrunk->aData[12], (k-1)*4);
          releasePage(pNewTrunk);
          if( !pPrevTrunk ){
            assert( sqlite3PagerIswriteable(pPage1->pDbPage) );
            put4byte(&pPage1->aData[32], iNewTrunk);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc ){
              goto end_allocate_page;
            }
            put4byte(&pPrevTrunk->aData[0], iNewTrunk);
          }
        }
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
#endif
      }else if( k>0 ){
        /* Extract a leaf from the trunk */
        u32 closest;
        Pgno iPage;
        unsigned char *aData = pTrunk->aData;
        if( nearby>0 ){
          u32 i;
          closest = 0;
          if( eMode==BTALLOC_LE ){
            for(i=0; i<k; i++){
              iPage = get4byte(&aData[8+i*4]);
              if( iPage<=nearby ){
                closest = i;
                break;
              }
            }
          }else{
            int dist;
            dist = sqlite3AbsInt32(get4byte(&aData[8]) - nearby);
            for(i=1; i<k; i++){
              int d2 = sqlite3AbsInt32(get4byte(&aData[8+i*4]) - nearby);
              if( d2<dist ){
                closest = i;
                dist = d2;
              }
            }
          }
        }else{
          closest = 0;
        }

        iPage = get4byte(&aData[8+closest*4]);
        testcase( iPage==mxPage );
        if( iPage>mxPage ){
          rc = SQLITE_CORRUPT_BKPT;
          goto end_allocate_page;
        }
        testcase( iPage==mxPage );
        if( !searchList 
         || (iPage==nearby || (iPage<nearby && eMode==BTALLOC_LE)) 
        ){
          int noContent;
          *pPgno = iPage;
          TRACE(("ALLOCATE: %d was leaf %d of %d on trunk %d"
                 ": %d more free pages\n",
                 *pPgno, closest+1, k, pTrunk->pgno, n-1));
          rc = sqlite3PagerWrite(pTrunk->pDbPage);
          if( rc ) goto end_allocate_page;
          if( closest<k-1 ){
            memcpy(&aData[8+closest*4], &aData[4+k*4], 4);
          }
          put4byte(&aData[4], k-1);
          noContent = !btreeGetHasContent(pBt, *pPgno)? PAGER_GET_NOCONTENT : 0;
          rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, noContent);
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerWrite((*ppPage)->pDbPage);
            if( rc!=SQLITE_OK ){
              releasePage(*ppPage);
              *ppPage = 0;
            }
          }
          searchList = 0;
        }
      }
      releasePage(pPrevTrunk);
      pPrevTrunk = 0;
    }while( searchList );
  }else{
    /* There are no pages on the freelist, so append a new page to the
    ** database image.
    **
    ** Normally, new pages allocated by this block can be requested from the
    ** pager layer with the 'no-content' flag set. This prevents the pager
    ** from trying to read the pages content from disk. However, if the
    ** current transaction has already run one or more incremental-vacuum
    ** steps, then the page we are about to allocate may contain content
    ** that is required in the event of a rollback. In this case, do
    ** not set the no-content flag. This causes the pager to load and journal
    ** the current page content before overwriting it.
    **
    ** Note that the pager will not actually attempt to load or journal 
    ** content for any page that really does lie past the end of the database
    ** file on disk. So the effects of disabling the no-content optimization
    ** here are confined to those pages that lie between the end of the
    ** database image and the end of the database file.
    */
    int bNoContent = (0==IfNotOmitAV(pBt->bDoTruncate))? PAGER_GET_NOCONTENT:0;

    rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
    if( rc ) return rc;
    pBt->nPage++;
    if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ) pBt->nPage++;

#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum && PTRMAP_ISPAGE(pBt, pBt->nPage) ){
      /* If *pPgno refers to a pointer-map page, allocate two new pages
      ** at the end of the file instead of one. The first allocated page
      ** becomes a new pointer-map page, the second is used by the caller.
      */
      MemPage *pPg = 0;
      TRACE(("ALLOCATE: %d from end of file (pointer-map page)\n", pBt->nPage));
      assert( pBt->nPage!=PENDING_BYTE_PAGE(pBt) );
      rc = btreeGetUnusedPage(pBt, pBt->nPage, &pPg, bNoContent);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pPg->pDbPage);
        releasePage(pPg);
      }
      if( rc ) return rc;
      pBt->nPage++;
      if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ){ pBt->nPage++; }
    }
#endif
    put4byte(28 + (u8*)pBt->pPage1->aData, pBt->nPage);
    *pPgno = pBt->nPage;

    assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );
    rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, bNoContent);
    if( rc ) return rc;
    rc = sqlite3PagerWrite((*ppPage)->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(*ppPage);
      *ppPage = 0;
    }
    TRACE(("ALLOCATE: %d from end of file\n", *pPgno));
  }

  assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );

end_allocate_page:
  releasePage(pTrunk);
  releasePage(pPrevTrunk);
  assert( rc!=SQLITE_OK || sqlite3PagerPageRefcount((*ppPage)->pDbPage)<=1 );
  assert( rc!=SQLITE_OK || (*ppPage)->isInit==0 );
  return rc;
}